

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QList<QRect> *
QMdi::MinOverlapPlacer::getCandidatePlacements
          (QList<QRect> *__return_storage_ptr__,QSize *size,QList<QRect> *rects,QRect *domain)

{
  int *piVar1;
  int *piVar2;
  iterator iVar3;
  iterator iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  QRect *rect;
  QRect *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QRect local_88;
  QArrayDataPointer<int> local_78;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  local_58.size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (int *)0x0;
  QList<int>::reserve((QList<int> *)&local_58,(rects->d).size + 2);
  QList<int>::append((QList<int> *)&local_58,(domain->x1).m_i);
  QList<int>::append((QList<int> *)&local_58,((domain->x2).m_i - (size->wd).m_i) + 1);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (int *)0x0;
  QList<int>::reserve((QList<int> *)&local_78,(rects->d).size + 2);
  QList<int>::append((QList<int> *)&local_78,(domain->y1).m_i);
  iVar7 = (domain->y2).m_i - (size->ht).m_i;
  if (-2 < iVar7) {
    QList<int>::append((QList<int> *)&local_78,iVar7 + 1);
  }
  pQVar8 = (rects->d).ptr;
  for (lVar6 = (rects->d).size << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
    QList<int>::append((QList<int> *)&local_58,(pQVar8->x2).m_i + 1);
    QList<int>::append((QList<int> *)&local_78,(pQVar8->y2).m_i + 1);
    pQVar8 = pQVar8 + 1;
  }
  iVar3 = QList<int>::begin((QList<int> *)&local_58);
  iVar4 = QList<int>::end((QList<int> *)&local_58);
  std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar3.i,iVar4.i);
  iVar3 = QList<int>::begin((QList<int> *)&local_58);
  iVar4 = QList<int>::end((QList<int> *)&local_58);
  iVar3 = std::__unique<QList<int>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>(iVar3.i,iVar4.i)
  ;
  iVar4 = QList<int>::end((QList<int> *)&local_58);
  QList<int>::erase((QList<int> *)&local_58,(const_iterator)iVar3.i,(const_iterator)iVar4.i);
  iVar3 = QList<int>::begin((QList<int> *)&local_78);
  iVar4 = QList<int>::end((QList<int> *)&local_78);
  std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar3.i,iVar4.i);
  iVar3 = QList<int>::begin((QList<int> *)&local_78);
  iVar4 = QList<int>::end((QList<int> *)&local_78);
  iVar3 = std::__unique<QList<int>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>(iVar3.i,iVar4.i)
  ;
  iVar4 = QList<int>::end((QList<int> *)&local_78);
  QList<int>::erase((QList<int> *)&local_78,(const_iterator)iVar3.i,(const_iterator)iVar4.i);
  QList<QRect>::reserve(__return_storage_ptr__,local_58.size * local_78.size);
  piVar1 = local_78.ptr + local_78.size;
  for (piVar5 = local_78.ptr; piVar2 = local_58.ptr, piVar5 != piVar1; piVar5 = piVar5 + 1) {
    iVar7 = *piVar5;
    lVar6 = local_58.size << 2;
    for (lVar9 = 0; lVar6 != lVar9; lVar9 = lVar9 + 4) {
      local_88.x1.m_i = *(int *)((long)piVar2 + lVar9);
      local_88.x2.m_i = local_88.x1.m_i + (size->wd).m_i + -1;
      local_88.y2.m_i = (size->ht).m_i + iVar7 + -1;
      local_88.y1.m_i = iVar7;
      QList<QRect>::emplaceBack<QRect>(__return_storage_ptr__,&local_88);
    }
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QRect> MinOverlapPlacer::getCandidatePlacements(const QSize &size, const QList<QRect> &rects,
                                                      const QRect &domain)
{
    QList<QRect> result;

    QList<int> xlist;
    xlist.reserve(2 + rects.size());
    xlist << domain.left() << domain.right() - size.width() + 1;

    QList<int> ylist;
    ylist.reserve(2 + rects.size());
    ylist << domain.top();
    if (domain.bottom() - size.height() + 1 >= 0)
        ylist << domain.bottom() - size.height() + 1;

    for (const QRect &rect : rects) {
        xlist << rect.right() + 1;
        ylist << rect.bottom() + 1;
    }

    std::sort(xlist.begin(), xlist.end());
    xlist.erase(std::unique(xlist.begin(), xlist.end()), xlist.end());

    std::sort(ylist.begin(), ylist.end());
    ylist.erase(std::unique(ylist.begin(), ylist.end()), ylist.end());

    result.reserve(ylist.size() * xlist.size());
    for (int y : std::as_const(ylist))
        for (int x : std::as_const(xlist))
            result << QRect(QPoint(x, y), size);
    return result;
}